

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  int iVar1;
  ZSTD_cpuid_t cpuid;
  ZSTD_CCtx *in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  size_t err;
  ZSTD_CCtx *cctx;
  ZSTD_CCtx *cctx_00;
  undefined1 in_stack_ffffffffffffffe0 [16];
  void *in_stack_fffffffffffffff0;
  ZSTD_CCtx *local_8;
  
  if ((in_stack_00000008 == (ZSTD_CCtx *)0x0) == (in_stack_00000010 == (ZSTD_freeFunction)0x0)) {
    customMem_00.opaque = in_stack_fffffffffffffff0;
    customMem_00._0_16_ = in_stack_ffffffffffffffe0;
    cctx_00 = in_stack_00000008;
    local_8 = (ZSTD_CCtx *)ZSTD_calloc((size_t)in_stack_00000018,customMem_00);
    if (local_8 == (ZSTD_CCtx *)0x0) {
      local_8 = (ZSTD_CCtx *)0x0;
    }
    else {
      (local_8->customMem).customAlloc = (ZSTD_allocFunction)in_stack_00000008;
      (local_8->customMem).customFree = in_stack_00000010;
      (local_8->customMem).opaque = in_stack_00000018;
      cpuid = ZSTD_cpuid();
      iVar1 = ZSTD_cpuid_bmi2(cpuid);
      local_8->bmi2 = iVar1;
      ZSTD_CCtx_resetParameters(cctx_00);
    }
  }
  else {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_calloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        cctx->customMem = customMem;
        cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
        {   size_t const err = ZSTD_CCtx_resetParameters(cctx);
            assert(!ZSTD_isError(err));
            (void)err;
        }
        return cctx;
    }
}